

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O3

Acb_Man_t *
Acb_ManAlloc(char *pFileName,int nNtks,Abc_Nam_t *pStrs,Abc_Nam_t *pFuns,Abc_Nam_t *pMods,
            Hash_IntMan_t *vHash)

{
  uint uVar1;
  Acb_Man_t *pAVar2;
  char *pcVar3;
  size_t sVar4;
  Abc_Nam_t *pAVar5;
  Abc_Nam_t *pAVar6;
  Hash_IntMan_t *pHVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  void **ppvVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  undefined4 in_register_00000034;
  
  pAVar5 = (Abc_Nam_t *)CONCAT44(in_register_00000034,nNtks);
  pAVar2 = (Acb_Man_t *)calloc(1,0x6e8);
  pcVar3 = Extra_FileDesignName(pFileName);
  pAVar2->pName = pcVar3;
  if (pFileName == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pFileName);
    pcVar3 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar3,pFileName);
  }
  pAVar2->pSpec = pcVar3;
  if (pAVar5 == (Abc_Nam_t *)0x0) {
    pAVar5 = Abc_NamStart(1000,0x18);
  }
  pAVar2->pStrs = pAVar5;
  pAVar5 = Abc_NamStart(100,0x18);
  pAVar2->pFuns = pAVar5;
  pAVar6 = Abc_NamStart(100,0x18);
  pAVar2->pMods = pAVar6;
  pHVar7 = (Hash_IntMan_t *)calloc(1,0x18);
  uVar13 = 1099;
  while( true ) {
    do {
      uVar12 = uVar13;
      uVar13 = uVar12 + 1;
    } while ((uVar12 & 1) != 0);
    if (uVar13 < 9) break;
    iVar11 = 5;
    while( true ) {
      if (uVar13 % (iVar11 - 2U) == 0) break;
      uVar1 = iVar11 * iVar11;
      iVar11 = iVar11 + 2;
      if (uVar13 < uVar1) goto LAB_0038dcbd;
    }
  }
LAB_0038dcbd:
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  uVar1 = 0x10;
  if (0xe < uVar12) {
    uVar1 = uVar13;
  }
  pVVar8->nCap = uVar1;
  piVar9 = (int *)malloc((long)(int)uVar1 << 2);
  pVVar8->pArray = piVar9;
  pVVar8->nSize = uVar13;
  if (piVar9 != (int *)0x0) {
    memset(piVar9,0,(long)(int)uVar13 << 2);
  }
  pHVar7->vTable = pVVar8;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 0x1130;
  piVar9 = (int *)malloc(0x44c0);
  pVVar8->pArray = piVar9;
  pHVar7->vObjs = pVVar8;
  piVar9[0] = 0;
  piVar9[1] = 0;
  piVar9[2] = 0;
  piVar9[3] = 0;
  pVVar8->nSize = 4;
  pHVar7->nRefs = 1;
  pAVar2->vHash = pHVar7;
  Abc_NamStrFindOrAdd(pAVar5,"1\'b0",(int *)0x0);
  Abc_NamStrFindOrAdd(pAVar5,"1\'b1",(int *)0x0);
  Abc_NamStrFindOrAdd(pAVar5,"1\'bx",(int *)0x0);
  Abc_NamStrFindOrAdd(pAVar5,"1\'bz",(int *)0x0);
  ppvVar10 = (void **)malloc(0x10);
  (pAVar2->vNtks).pArray = ppvVar10;
  (pAVar2->vNtks).nCap = 2;
  (pAVar2->vNtks).nSize = 1;
  *ppvVar10 = (void *)0x0;
  pAVar2->iRoot = 1;
  return pAVar2;
}

Assistant:

static inline Acb_Man_t * Acb_ManAlloc( char * pFileName, int nNtks, Abc_Nam_t * pStrs, Abc_Nam_t * pFuns, Abc_Nam_t * pMods, Hash_IntMan_t * vHash )
{
    Acb_Man_t * pNew = ABC_CALLOC( Acb_Man_t, 1 );
    pNew->pName = Extra_FileDesignName( pFileName );
    pNew->pSpec = Abc_UtilStrsav( pFileName );
    pNew->pStrs = pStrs ? pStrs : Abc_NamStart( 1000, 24 );
    pNew->pFuns = pFuns ? pFuns : Abc_NamStart( 100, 24 );
    pNew->pMods = pMods ? pMods : Abc_NamStart( 100, 24 );
    pNew->vHash = vHash ? vHash : Hash_IntManStart( 1000 );
    if ( pFuns == NULL )
    {
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'b0", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'b1", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'bx", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'bz", NULL);
    }
//    if ( vHash == NULL )
//        Hash_Int2ManInsert( pNew->vHash, 0, 0, 0 );
    Vec_PtrGrow( &pNew->vNtks,  nNtks+1 ); Vec_PtrPush( &pNew->vNtks, NULL );
    // set default root module
    pNew->iRoot = 1;
    return pNew;
}